

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

short __thiscall
duckdb::Interpolator<true>::Operation<short,short,duckdb::QuantileDirect<short>>
          (Interpolator<true> *this,short *v_t,Vector *result,QuantileDirect<short> *accessor)

{
  RESULT_TYPE_conflict input;
  short sVar1;
  
  input = InterpolateInternal<short,duckdb::QuantileDirect<short>>(this,v_t,accessor);
  sVar1 = Cast::Operation<short,short>(input);
  return sVar1;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}